

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

char * form_bit_name(long *form_flags)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 uVar5;
  
  form_bit_name::buf[0] = '\0';
  if ((*form_flags & 2U) == 0) {
    if ((*form_flags & 1U) == 0) goto LAB_002fcda1;
    uVar5 = 0x656c6269646520;
  }
  else {
    uVar5 = 0x6e6f73696f7020;
  }
  sVar3 = strlen(form_bit_name::buf);
  *(undefined8 *)(form_bit_name::buf + sVar3) = uVar5;
LAB_002fcda1:
  uVar4 = *form_flags;
  if ((uVar4 & 4) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," magical",8);
    form_bit_name::buf[sVar3 + 8] = '\0';
    uVar4 = *form_flags;
  }
  if ((uVar4 & 8) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," instant",8);
    builtin_strncpy(form_bit_name::buf + sVar3 + 5,"ant_rot",8);
    uVar4 = *form_flags;
  }
  if ((uVar4 & 0x10) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," oth",4);
    builtin_strncpy(form_bit_name::buf + sVar3 + 3,"her",4);
    uVar4 = *form_flags;
  }
  uVar2 = (uint)uVar4;
  if ((uVar4 & 0x40) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," animal",8);
    uVar2 = (uint)*form_flags;
  }
  if ((char)uVar2 < '\0') {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," sentien",8);
    (form_bit_name::buf + sVar3 + 8)[0] = 't';
    (form_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," undead",8);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," constru",8);
    builtin_strncpy(form_bit_name::buf + sVar3 + 7,"uct",4);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," mis",4);
    (form_bit_name::buf + sVar3 + 4)[0] = 't';
    (form_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," intangi",8);
    builtin_strncpy(form_bit_name::buf + sVar3 + 8,"ble",4);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," bip",4);
    builtin_strncpy(form_bit_name::buf + sVar3 + 3,"ped",4);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," aquatic",8);
    form_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," insect",8);
    uVar2 = (uint)*form_flags;
  }
  if ((short)uVar2 < 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," spider",8);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," crustac",8);
    builtin_strncpy(form_bit_name::buf + sVar3 + 8,"ean",4);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," wor",4);
    (form_bit_name::buf + sVar3 + 4)[0] = 'm';
    (form_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," blo",4);
    (form_bit_name::buf + sVar3 + 4)[0] = 'b';
    (form_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x15 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," mammal",8);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x16 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," bir",4);
    (form_bit_name::buf + sVar3 + 4)[0] = 'd';
    (form_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x17 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," reptile",8);
    form_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x18 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," sna",4);
    builtin_strncpy(form_bit_name::buf + sVar3 + 3,"ake",4);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x19 & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," dragon",8);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x1a & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," amphibi",8);
    builtin_strncpy(form_bit_name::buf + sVar3 + 7,"ian",4);
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x1b & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," fis",4);
    (form_bit_name::buf + sVar3 + 4)[0] = 'h';
    (form_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*form_flags;
  }
  if ((uVar2 >> 0x1c & 1) != 0) {
    sVar3 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar3," cold_bl",8);
    builtin_strncpy(form_bit_name::buf + sVar3 + 6,"blooded",8);
  }
  pcVar1 = form_bit_name::buf;
  if (form_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *form_bit_name(long form_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(form_flags, FORM_POISON))
		strcat(buf, " poison");
	else if (IS_SET(form_flags, FORM_EDIBLE))
		strcat(buf, " edible");

	if (IS_SET(form_flags, FORM_MAGICAL))
		strcat(buf, " magical");

	if (IS_SET(form_flags, FORM_INSTANT_DECAY))
		strcat(buf, " instant_rot");

	if (IS_SET(form_flags, FORM_OTHER))
		strcat(buf, " other");

	if (IS_SET(form_flags, FORM_ANIMAL))
		strcat(buf, " animal");

	if (IS_SET(form_flags, FORM_SENTIENT))
		strcat(buf, " sentient");

	if (IS_SET(form_flags, FORM_UNDEAD))
		strcat(buf, " undead");

	if (IS_SET(form_flags, FORM_CONSTRUCT))
		strcat(buf, " construct");

	if (IS_SET(form_flags, FORM_MIST))
		strcat(buf, " mist");

	if (IS_SET(form_flags, FORM_INTANGIBLE))
		strcat(buf, " intangible");

	if (IS_SET(form_flags, FORM_BIPED))
		strcat(buf, " biped");

	if (IS_SET(form_flags, FORM_AQUATIC))
		strcat(buf, " aquatic");

	if (IS_SET(form_flags, FORM_INSECT))
		strcat(buf, " insect");

	if (IS_SET(form_flags, FORM_SPIDER))
		strcat(buf, " spider");

	if (IS_SET(form_flags, FORM_CRUSTACEAN))
		strcat(buf, " crustacean");

	if (IS_SET(form_flags, FORM_WORM))
		strcat(buf, " worm");

	if (IS_SET(form_flags, FORM_BLOB))
		strcat(buf, " blob");

	if (IS_SET(form_flags, FORM_MAMMAL))
		strcat(buf, " mammal");

	if (IS_SET(form_flags, FORM_BIRD))
		strcat(buf, " bird");

	if (IS_SET(form_flags, FORM_REPTILE))
		strcat(buf, " reptile");

	if (IS_SET(form_flags, FORM_SNAKE))
		strcat(buf, " snake");

	if (IS_SET(form_flags, FORM_DRAGON))
		strcat(buf, " dragon");

	if (IS_SET(form_flags, FORM_AMPHIBIAN))
		strcat(buf, " amphibian");

	if (IS_SET(form_flags, FORM_FISH))
		strcat(buf, " fish");

	if (IS_SET(form_flags, FORM_COLD_BLOOD))
		strcat(buf, " cold_blooded");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}